

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O1

uint64_t hashall(substring s,uint64_t h)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = (uint)h;
  uVar1 = (int)s.end - (int)s.begin;
  uVar6 = uVar1;
  if ((int)uVar1 < 0) {
    uVar6 = uVar1 + 3;
  }
  pbVar2 = (byte *)(s.begin + (int)(uVar6 & 0xfffffffc));
  if (6 < uVar1 + 3) {
    lVar4 = (long)-((int)uVar6 >> 2);
    do {
      uVar6 = ((uint)(*(int *)(pbVar2 + lVar4 * 4) * -0x3361d2af) >> 0x11 |
              *(int *)(pbVar2 + lVar4 * 4) * 0x16a88000) * 0x1b873593 ^ (uint)h;
      uVar5 = (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64;
      h = (uint64_t)uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
  }
  uVar3 = 0;
  uVar6 = 0;
  switch(uVar1 & 3) {
  case 3:
    uVar6 = (uint)pbVar2[2] << 0x10;
  case 2:
    uVar3 = uVar6 | (uint)pbVar2[1] << 8;
  case 1:
    uVar5 = uVar5 ^ ((*pbVar2 ^ uVar3) * -0x3361d2af >> 0x11 | (*pbVar2 ^ uVar3) * 0x16a88000) *
                    0x1b873593;
  case 0:
    uVar1 = ((uVar5 ^ uVar1) >> 0x10 ^ uVar5 ^ uVar1) * -0x7a143595;
    uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
    return (ulong)(uVar1 >> 0x10 ^ uVar1);
  }
}

Assistant:

uint64_t hashall(substring s, uint64_t h) { return uniform_hash((unsigned char*)s.begin, s.end - s.begin, h); }